

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O1

void genInstruction(int a,int b)

{
  long lVar1;
  
  if (b < 0x10) {
    lVar1 = (long)byteTop;
    byteTop = byteTop + 1;
    byteBuffer[lVar1] = (char)(a << 4) + (uchar)b;
  }
  else {
    genInstruction(0,a);
    lVar1 = (long)byteTop;
    byteTop = byteTop + 1;
    byteBuffer[lVar1] = (uchar)b;
  }
  if (lVar1 < 0x7ff) {
    return;
  }
  error_impl("genByte",0x354,"too many bytecodes");
  return;
}

Assistant:

void genInstruction(int a, int b)
{
    /*printf("gen instruction %d %d\n", a, b); */
    if (b < 16) {
        genByte(a * 16 + b);
    } else {
        genInstruction(0, a);
        genByte(b);
    }
}